

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PduHeader.h
# Opt level: O0

PduHeader * __thiscall DIS::PduHeader::operator=(PduHeader *this,PduHeader *param_1)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  uint uVar4;
  undefined1 uVar5;
  unsigned_short uVar6;
  PduHeader *param_1_local;
  PduHeader *this_local;
  
  uVar1 = param_1->_exerciseID;
  uVar2 = param_1->_pduType;
  uVar3 = param_1->_protocolFamily;
  uVar4 = param_1->_timestamp;
  this->_protocolVersion = param_1->_protocolVersion;
  this->_exerciseID = uVar1;
  this->_pduType = uVar2;
  this->_protocolFamily = uVar3;
  this->_timestamp = uVar4;
  uVar5 = param_1->field_0x11;
  uVar6 = param_1->_pduStatus;
  this->_pduLength = param_1->_pduLength;
  this->field_0x11 = uVar5;
  this->_pduStatus = uVar6;
  this->_padding = param_1->_padding;
  return this;
}

Assistant:

class OPENDIS7_EXPORT PduHeader
{
protected:
  /** The version of the protocol. 5=DIS-1995, 6=DIS-1998, 7=DIS-2009. */
  unsigned char _protocolVersion; 

  /** Exercise ID */
  unsigned char _exerciseID; 

  /** Type of pdu, unique for each PDU class */
  unsigned char _pduType; 

  /** value that refers to the protocol family, eg SimulationManagement, etc */
  unsigned char _protocolFamily; 

  /** Timestamp value */
  unsigned int _timestamp; 

  /** Length, in bytes, of the PDU. Changed name from length to avoid use of Hibernate QL reserved word. */
  unsigned char _pduLength; 

  /** PDU Status Record. Described in 6.2.67. This field is not present in earlier DIS versions  */
  unsigned short _pduStatus; 

  /** zero filled array of padding */
  unsigned char _padding; 


 public:
    PduHeader();
    virtual ~PduHeader();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned char getProtocolVersion() const; 
    void setProtocolVersion(unsigned char pX); 

    unsigned char getExerciseID() const; 
    void setExerciseID(unsigned char pX); 

    unsigned char getPduType() const; 
    void setPduType(unsigned char pX); 

    unsigned char getProtocolFamily() const; 
    void setProtocolFamily(unsigned char pX); 

    unsigned int getTimestamp() const; 
    void setTimestamp(unsigned int pX); 

    unsigned char getPduLength() const; 
    void setPduLength(unsigned char pX); 

    unsigned short getPduStatus() const; 
    void setPduStatus(unsigned short pX); 

    unsigned char getPadding() const; 
    void setPadding(unsigned char pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const PduHeader& rhs) const;
}